

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

void __thiscall Bmp::Bmp(Bmp *this,string *file)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  FILE *__stream;
  BmpColor **ppBVar4;
  BmpColor *pBVar5;
  int i;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong local_38;
  
  __stream = fopen((file->_M_dataplus)._M_p,"rb");
  fread(&this->m_bf,1,0xe,__stream);
  fread(&this->m_bi,1,0x28,__stream);
  uVar1 = (this->m_bi).biWidth;
  uVar11 = (ulong)(int)uVar1;
  this->m_w = uVar1;
  uVar2 = (this->m_bi).biHeight;
  local_38 = (ulong)uVar2;
  this->m_h = uVar2;
  uVar9 = uVar11 * 8;
  if ((long)uVar11 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  ppBVar4 = (BmpColor **)operator_new__(uVar9);
  this->m_data = ppBVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)uVar2;
  uVar9 = SUB168(auVar3 * ZEXT816(3),0);
  if (SUB168(auVar3 * ZEXT816(3),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar10 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    pBVar5 = (BmpColor *)operator_new__(uVar9);
    this->m_data[uVar10] = pBVar5;
  }
  while (0 < (int)local_38) {
    local_38 = local_38 - 1;
    for (lVar8 = 0; lVar8 < (int)uVar11; lVar8 = lVar8 + 1) {
      fread(&this->m_data[lVar8][local_38].b,1,1,__stream);
      fread(&this->m_data[lVar8][local_38].g,1,1,__stream);
      fread(this->m_data[lVar8] + local_38,1,1,__stream);
      uVar11 = (ulong)(uint)this->m_w;
    }
    for (iVar6 = 0;
        iVar6 < (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) % 4);
        iVar6 = iVar6 + 1) {
      fgetc(__stream);
      uVar11 = (ulong)(uint)this->m_w;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

Bmp::Bmp(const std::string& file)
{
    FILE* f = fopen(file.c_str(), "rb");

    fread(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fread(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);

    m_w = m_bi.biWidth, m_h = m_bi.biHeight;
    m_data = new BmpColor*[m_w];
    for (int i = 0; i < m_w; i++) m_data[i] = new BmpColor[m_h];

    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fread(&m_data[i][j].b, 1, sizeof(byte), f);
            fread(&m_data[i][j].g, 1, sizeof(byte), f);
            fread(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fgetc(f);
    }

    fclose(f);
}